

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::Generator(Generator *this)

{
  Generator *this_local;
  
  CodeGenerator::CodeGenerator(&this->super_CodeGenerator);
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__Generator_008e6be0;
  internal::WrappedMutex::WrappedMutex(&this->mutex_);
  this->file_ = (FileDescriptor *)0x0;
  std::__cxx11::string::string((string *)&this->file_descriptor_serialized_);
  return;
}

Assistant:

Generator::Generator() : file_(nullptr) {}